

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtsc.c
# Opt level: O3

void cpu_tsc_unmark(cpu_mark_t *mark)

{
  timeval tv;
  uint64_t local_38 [2];
  timeval local_28;
  
  cpu_rdtsc(local_38);
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  mark->tsc = local_38[0] - mark->tsc;
  mark->sys_clock = (local_28.tv_sec * 1000000 + local_28.tv_usec) - mark->sys_clock;
  return;
}

Assistant:

void cpu_tsc_unmark(struct cpu_mark_t* mark)
{
	struct cpu_mark_t temp;
	cpu_tsc_mark(&temp);
	mark_t_subtract(&temp, mark, mark);
}